

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMatcherTestCase.cpp
# Opt level: O1

void __thiscall TestmatchMultiple::~TestmatchMultiple(TestmatchMultiple *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST( matchMultiple )
{
  OrderMatcher object;
  Order order1("1", "LNUX", "OWNER1", "TARGET",
               Order::sell, Order::limit, 12.32, 50);
  Order order2("2", "LNUX", "OWNER2", "TARGET",
               Order::sell, Order::limit, 12.30, 50);
  Order order3("3", "LNUX", "OWNER3", "TARGET",
               Order::buy, Order::limit, 12.32, 100);

  CHECK(object.insert(order1));
  CHECK(object.insert(order2));
  CHECK(object.insert(order3));

  std::queue<Order> orders;
  CHECK(object.match("LNUX", orders));
  CHECK_EQUAL(4U, orders.size());

  Order matchedOrder3_1 = orders.front();
  orders.pop();
  Order matchedOrder2 = orders.front();
  orders.pop();
  Order matchedOrder3_2 = orders.front();
  orders.pop();
  Order matchedOrder1 = orders.front();
  orders.pop();

  CHECK_EQUAL("3", matchedOrder3_1.getClientID());
  CHECK(!matchedOrder3_1.isFilled());
  CHECK(!matchedOrder3_1.isClosed());
  CHECK_EQUAL(50, matchedOrder3_1.getOpenQuantity());
  CHECK_EQUAL(50, matchedOrder3_1.getExecutedQuantity());
  CHECK_EQUAL(12.30, matchedOrder3_1.getAvgExecutedPrice());
  CHECK_EQUAL(12.30, matchedOrder3_1.getLastExecutedPrice());
  CHECK_EQUAL(50, matchedOrder3_1.getLastExecutedQuantity());

  CHECK_EQUAL("2", matchedOrder2.getClientID());
  CHECK(matchedOrder2.isFilled());
  CHECK(matchedOrder2.isClosed());
  CHECK_EQUAL(0, matchedOrder2.getOpenQuantity());
  CHECK_EQUAL(50, matchedOrder2.getExecutedQuantity());
  CHECK_EQUAL(12.3, matchedOrder2.getAvgExecutedPrice());
  CHECK_EQUAL(12.3, matchedOrder2.getLastExecutedPrice());
  CHECK_EQUAL(50, matchedOrder2.getLastExecutedQuantity());

  CHECK_EQUAL("3", matchedOrder3_2.getClientID());
  CHECK(matchedOrder3_2.isFilled());
  CHECK(matchedOrder3_2.isClosed());
  CHECK_EQUAL(0, matchedOrder3_2.getOpenQuantity());
  CHECK_EQUAL(100, matchedOrder3_2.getExecutedQuantity());
  CHECK_EQUAL(12.31, matchedOrder3_2.getAvgExecutedPrice());
  CHECK_EQUAL(12.32, matchedOrder3_2.getLastExecutedPrice());
  CHECK_EQUAL(50, matchedOrder3_2.getLastExecutedQuantity());

  CHECK_EQUAL("1", matchedOrder1.getClientID());
  CHECK(matchedOrder1.isFilled());
  CHECK(matchedOrder1.isClosed());
  CHECK_EQUAL(0, matchedOrder1.getOpenQuantity());
  CHECK_EQUAL(50, matchedOrder1.getExecutedQuantity());
  CHECK_EQUAL(12.32, matchedOrder1.getAvgExecutedPrice());
  CHECK_EQUAL(12.32, matchedOrder1.getLastExecutedPrice());
  CHECK_EQUAL(50, matchedOrder1.getLastExecutedQuantity());
}